

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::fix_in_buffer(jpeg_decoder *this)

{
  int iVar1;
  uint uVar2;
  uint8 *puVar3;
  uint8 uVar4;
  uint8 uVar5;
  uint uVar6;
  uint uVar7;
  
  if (this->m_bits_left == 0x10) {
    puVar3 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar3 + -1;
    puVar3[-1] = (uint8)this->m_bit_buf;
    this->m_in_buf_left = this->m_in_buf_left + 1;
  }
  if (7 < this->m_bits_left) {
    uVar4 = *(uint8 *)((long)&this->m_bit_buf + 1);
    puVar3 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = puVar3 + -1;
    puVar3[-1] = uVar4;
    this->m_in_buf_left = this->m_in_buf_left + 1;
  }
  uVar4 = *(uint8 *)((long)&this->m_bit_buf + 2);
  puVar3 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = puVar3 + -1;
  puVar3[-1] = uVar4;
  this->m_in_buf_left = this->m_in_buf_left + 1;
  uVar4 = *(uint8 *)((long)&this->m_bit_buf + 3);
  puVar3 = this->m_pIn_buf_ofs;
  this->m_pIn_buf_ofs = puVar3 + -1;
  puVar3[-1] = uVar4;
  iVar1 = this->m_in_buf_left;
  this->m_in_buf_left = iVar1 + 1;
  this->m_bits_left = 0;
  uVar6 = this->m_bit_buf << 0x10;
  this->m_bit_buf = uVar6;
  if (iVar1 < 1) {
LAB_0012098a:
    uVar4 = get_octet(this);
    uVar5 = get_octet(this);
    this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar4,uVar5);
  }
  else {
    puVar3 = this->m_pIn_buf_ofs;
    if ((*puVar3 == 0xff) || (puVar3[1] == 0xff)) goto LAB_0012098a;
    this->m_bit_buf = CONCAT11(*puVar3,puVar3[1]) | uVar6;
    this->m_in_buf_left = iVar1 + -1;
    this->m_pIn_buf_ofs = puVar3 + 2;
  }
  uVar2 = this->m_bit_buf;
  uVar7 = uVar2 << (-(char)this->m_bits_left & 0x1fU);
  this->m_bit_buf = uVar7;
  if (0 < this->m_bits_left) {
    this->m_bit_buf = uVar7 << 0x10;
    return;
  }
  uVar6 = uVar2 << 0x10;
  this->m_bit_buf = uVar6;
  if (1 < this->m_in_buf_left) {
    puVar3 = this->m_pIn_buf_ofs;
    if ((*puVar3 != 0xff) && (puVar3[1] != 0xff)) {
      this->m_bit_buf = CONCAT11(*puVar3,puVar3[1]) | uVar6;
      this->m_in_buf_left = this->m_in_buf_left + -2;
      this->m_pIn_buf_ofs = puVar3 + 2;
      goto LAB_00120a4d;
    }
  }
  uVar4 = get_octet(this);
  uVar5 = get_octet(this);
  this->m_bit_buf = this->m_bit_buf | (uint)CONCAT11(uVar4,uVar5);
LAB_00120a4d:
  this->m_bit_buf = this->m_bit_buf << (-(char)this->m_bits_left & 0x1fU);
  this->m_bits_left = this->m_bits_left + 0x10;
  return;
}

Assistant:

void jpeg_decoder::fix_in_buffer() {
  // In case any 0xFF's where pulled into the buffer during marker scanning.
  JPGD_ASSERT((m_bits_left & 7) == 0);

  if (m_bits_left == 16)
    stuff_char((uint8)(m_bit_buf & 0xFF));

  if (m_bits_left >= 8)
    stuff_char((uint8)((m_bit_buf >> 8) & 0xFF));

  stuff_char((uint8)((m_bit_buf >> 16) & 0xFF));
  stuff_char((uint8)((m_bit_buf >> 24) & 0xFF));

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}